

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int ecdsa_signature_to_asn1(mbedtls_mpi *r,mbedtls_mpi *s,uchar *sig,size_t *slen)

{
  long lVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  size_t len;
  uchar *p;
  uchar buf [139];
  int ret;
  size_t *slen_local;
  uchar *sig_local;
  mbedtls_mpi *s_local;
  mbedtls_mpi *r_local;
  
  len = (size_t)(buf + 0x83);
  r_local._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)&p,s);
  if (-1 < r_local._4_4_) {
    lVar1 = (long)r_local._4_4_;
    r_local._4_4_ = mbedtls_asn1_write_mpi((uchar **)&len,(uchar *)&p,r);
    if (-1 < r_local._4_4_) {
      lVar2 = (long)r_local._4_4_;
      r_local._4_4_ = mbedtls_asn1_write_len((uchar **)&len,(uchar *)&p,lVar2 + lVar1);
      if (-1 < r_local._4_4_) {
        lVar3 = (long)r_local._4_4_;
        r_local._4_4_ = mbedtls_asn1_write_tag((uchar **)&len,(uchar *)&p,'0');
        if (-1 < r_local._4_4_) {
          __n = (long)r_local._4_4_ + lVar3 + lVar2 + lVar1;
          memcpy(sig,(void *)len,__n);
          *slen = __n;
          r_local._4_4_ = 0;
        }
      }
    }
  }
  return r_local._4_4_;
}

Assistant:

static int ecdsa_signature_to_asn1( const mbedtls_mpi *r, const mbedtls_mpi *s,
                                    unsigned char *sig, size_t *slen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char buf[MBEDTLS_ECDSA_MAX_LEN];
    unsigned char *p = buf + sizeof( buf );
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &p, buf, s ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_mpi( &p, buf, r ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &p, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &p, buf,
                                       MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) );

    memcpy( sig, p, len );
    *slen = len;

    return( 0 );
}